

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O2

void cmsysProcess_Delete(cmsysProcess *cp)

{
  if (cp != (cmsysProcess *)0x0) {
    if (cp->State == 3) {
      if (cp->Detached == 0) {
        cmsysProcess_WaitForExit(cp,(double *)0x0);
      }
      else {
        cmsysProcess_Disown(cp);
      }
    }
    cmsysProcess_SetCommand(cp,(char **)0x0);
    cmsysProcess_SetWorkingDirectory(cp,(char *)0x0);
    cmsysProcess_SetPipeFile(cp,1,(char *)0x0);
    cmsysProcess_SetPipeFile(cp,2,(char *)0x0);
    cmsysProcess_SetPipeFile(cp,3,(char *)0x0);
    free(cp->CommandExitCodes);
    free(cp->ProcessResults);
    free(cp);
    return;
  }
  return;
}

Assistant:

void kwsysProcess_Delete(kwsysProcess* cp)
{
  /* Make sure we have an instance.  */
  if (!cp) {
    return;
  }

  /* If the process is executing, wait for it to finish.  */
  if (cp->State == kwsysProcess_State_Executing) {
    if (cp->Detached) {
      kwsysProcess_Disown(cp);
    } else {
      kwsysProcess_WaitForExit(cp, 0);
    }
  }

  /* Free memory.  */
  kwsysProcess_SetCommand(cp, 0);
  kwsysProcess_SetWorkingDirectory(cp, 0);
  kwsysProcess_SetPipeFile(cp, kwsysProcess_Pipe_STDIN, 0);
  kwsysProcess_SetPipeFile(cp, kwsysProcess_Pipe_STDOUT, 0);
  kwsysProcess_SetPipeFile(cp, kwsysProcess_Pipe_STDERR, 0);
  free(cp->CommandExitCodes);
  free(cp->ProcessResults);
  free(cp);
}